

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

GLFWmonitor * vera::getMonitorFromWindow(GLFWwindow *window)

{
  uint uVar1;
  GLFWmonitor **ppGVar2;
  GLFWvidmode *pGVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint local_78;
  uint uStack_74;
  int iStack_70;
  int aiStack_6c [4];
  int monitorCount;
  undefined8 local_58;
  uint uStack_50;
  int aiStack_4c [3];
  _rect monitorRect;
  
  local_58 = 0;
  uStack_50 = 0;
  aiStack_4c[0] = 0;
  if (window == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/window.cpp"
                  ,0x81,"GLFWmonitor *vera::getMonitorFromWindow(GLFWwindow *)");
  }
  ppGVar2 = glfwGetMonitors(&monitorCount);
  if (monitorCount != 1) {
    uVar10 = 0;
    if (monitorCount < 2) {
      return (GLFWmonitor *)0x0;
    }
    glfwGetWindowPos(window,(int *)&local_78,(int *)&uStack_74);
    glfwGetWindowSize(window,&iStack_70,aiStack_6c);
    glfwGetWindowFrameSize
              (window,(int *)&local_58,(int *)((long)&local_58 + 4),(int *)&uStack_50,aiStack_4c);
    iVar11 = (int)(local_58 >> 0x20);
    iStack_70 = uStack_50 + (int)local_58 + iStack_70;
    aiStack_6c[0] = aiStack_4c[0] + iVar11 + aiStack_6c[0];
    local_78 = local_78 - (int)local_58;
    uStack_74 = uStack_74 - iVar11;
    uVar5 = 0xffffffffffffffff;
    iVar11 = 0;
    for (uVar9 = 0; (long)uVar9 < (long)monitorCount; uVar9 = uVar9 + 1) {
      glfwGetMonitorPos(ppGVar2[uVar9],&monitorRect.x,&monitorRect.y);
      pGVar3 = glfwGetVideoMode(ppGVar2[uVar9]);
      monitorRect.w = pGVar3->width;
      monitorRect.h = pGVar3->height;
      iVar6 = monitorRect.w + monitorRect.x;
      if ((((iVar6 < (int)local_78) || (iVar7 = iStack_70 + local_78, iVar7 < monitorRect.x)) ||
          (aiStack_4c[0] = monitorRect.h + monitorRect.y, aiStack_4c[0] < (int)uStack_74)) ||
         (iVar8 = aiStack_6c[0] + uStack_74, iVar8 < monitorRect.y)) {
        uStack_50 = 0;
        aiStack_4c[0] = 0;
        local_58 = 0;
        uVar4 = 0;
      }
      else {
        uVar4 = monitorRect.x;
        if (monitorRect.x < (int)local_78) {
          uVar4 = local_78;
        }
        if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
        uStack_50 = iVar6 - uVar4;
        uVar1 = monitorRect.y;
        if (monitorRect.y < (int)uStack_74) {
          uVar1 = uStack_74;
        }
        if (iVar8 < aiStack_4c[0]) {
          aiStack_4c[0] = iVar8;
        }
        aiStack_4c[0] = aiStack_4c[0] - uVar1;
        local_58 = (ulong)uVar1 << 0x20;
      }
      local_58 = local_58 | uVar4;
      if (aiStack_4c[0] * uStack_50 != 0 && iVar11 * uVar10 < aiStack_4c[0] * uStack_50) {
        uVar5 = uVar9;
        iVar11 = aiStack_4c[0];
        uVar10 = uStack_50;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    if ((int)uVar5 < 0) {
      return (GLFWmonitor *)0x0;
    }
    ppGVar2 = ppGVar2 + (uVar5 & 0xffffffff);
  }
  return *ppGVar2;
}

Assistant:

GLFWAPI GLFWmonitor* getMonitorFromWindow(GLFWwindow* window) {  
    GLFWmonitor* result = NULL;

    int monitorCount;
    GLFWmonitor** monitors;
    const GLFWvidmode* vidmode;

    unsigned int currentDim, overlapDim;
    int overlapMonitor, i;

    _rect windowRect;
    _rect monitorRect;
    _rect scratchRect = { 0, 0, 0, 0 };
    _rect overlapRect = { 0, 0, 0, 0 };

    assert(window != NULL);

    // _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    monitors = glfwGetMonitors(&monitorCount);

    if (monitorCount == 1)
        result = monitors[0];

    else if (monitorCount > 1) {
        glfwGetWindowPos(window, &windowRect.x, &windowRect.y);
        glfwGetWindowSize(window, &windowRect.w, &windowRect.h);

        glfwGetWindowFrameSize(window, &scratchRect.x, &scratchRect.y, 
        &scratchRect.w, &scratchRect.h);

        windowRect.x -= scratchRect.x;
        windowRect.y -= scratchRect.y;
        windowRect.w += scratchRect.x + scratchRect.w;
        windowRect.h += scratchRect.y + scratchRect.h;

        overlapMonitor = -1;

        for (i = 0; i < monitorCount; i++) {
            glfwGetMonitorPos(monitors[i], &monitorRect.x, &monitorRect.y);

            vidmode = glfwGetVideoMode(monitors[i]);
            monitorRect.w = vidmode->width;
            monitorRect.h = vidmode->height;

            scratchRect = _get_intersection(&windowRect, &monitorRect);

            currentDim = scratchRect.w * scratchRect.h;
            overlapDim = overlapRect.w * overlapRect.h;

            if (currentDim > 0 && currentDim > overlapDim) {
                overlapRect = scratchRect;
                overlapMonitor = i;
            }
        }

        if (overlapMonitor >= 0)
        result = monitors[overlapMonitor];
    }

    return result;
}